

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  void *pvVar1;
  ImGuiTableCellData *pIVar2;
  size_t size;
  ImSpanAllocator<3> span_allocator;
  undefined8 local_28;
  
  local_28 = 0;
  local_28._0_4_ = 0;
  local_28._4_4_ = columns_count * 0x68;
  size = (long)(columns_count << 3) + (long)(columns_count * 0x69);
  pvVar1 = MemAlloc(size);
  table->RawData = pvVar1;
  memset(pvVar1,0,size);
  pvVar1 = table->RawData;
  local_28._0_4_ = (int)local_28;
  local_28._4_4_ = SUB84(local_28,4);
  (table->Columns).Data = (ImGuiTableColumn *)((long)(int)local_28 + (long)pvVar1);
  (table->Columns).DataEnd = (ImGuiTableColumn *)((long)local_28._4_4_ + (long)pvVar1);
  pIVar2 = (ImGuiTableCellData *)((long)(columns_count * 0x69) + (long)pvVar1);
  (table->DisplayOrderToIndex).Data = (char *)((long)local_28._4_4_ + (long)pvVar1);
  (table->DisplayOrderToIndex).DataEnd = (char *)pIVar2;
  (table->RowCellData).Data = pIVar2;
  (table->RowCellData).DataEnd = (ImGuiTableCellData *)(size + (long)pvVar1);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.ReserveBytes(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}